

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

int32_t * protobuf_test_messages_proto2_TestAllTypesProto2_repeated_int32
                    (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,size_t *size)

{
  upb_Array *puVar1;
  int32_t *piVar2;
  upb_MiniTableField field;
  upb_MiniTableField local_18;
  
  local_18.number_dont_copy_me__upb_internal_use_only = 0x1f;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x150;
  local_18.presence = 0;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\x05';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  puVar1 = upb_Message_GetArray(&msg->base_dont_copy_me__upb_internal_use_only,&local_18);
  if (puVar1 == (upb_Array *)0x0) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    piVar2 = (int32_t *)0x0;
  }
  else {
    if (size != (size_t *)0x0) {
      *size = puVar1->size_dont_copy_me__upb_internal_use_only;
    }
    piVar2 = (int32_t *)(puVar1->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8);
  }
  return piVar2;
}

Assistant:

UPB_INLINE int32_t const* protobuf_test_messages_proto2_TestAllTypesProto2_repeated_int32(const protobuf_test_messages_proto2_TestAllTypesProto2* msg, size_t* size) {
  const upb_MiniTableField field = {31, UPB_SIZE(64, 336), 0, kUpb_NoSub, 5, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (int32_t const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}